

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraohRandomWalk_SRW.h
# Opt level: O3

Estimates * SRW1(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  double dVar1;
  undefined1 auVar2 [16];
  Parameters params_00;
  size_type __n;
  uint uVar3;
  void *v1;
  EdgeIdx *pEVar4;
  result_type rVar5;
  void *pvVar6;
  ulong uVar7;
  size_t __i;
  long lVar8;
  long lVar9;
  double dVar10;
  long lVar11;
  void *pvVar12;
  ulong *puVar13;
  int iVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  size_type __n_00;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  uniform_int_distribution<long> dist_parent_nbor;
  uniform_int_distribution<long> dist_parent;
  OrderedEdgeCollection randomEdgeCollection;
  mt19937 mt;
  random_device rd;
  double dVar21;
  long in_stack_ffffffffffffc320;
  long in_stack_ffffffffffffc330;
  pointer pOVar22;
  iterator __position;
  OrderedEdge *pOVar23;
  void *pvVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double in_stack_ffffffffffffc370;
  ulong *in_stack_ffffffffffffc378;
  undefined8 in_stack_ffffffffffffc380;
  ulong *in_stack_ffffffffffffc388;
  uint in_stack_ffffffffffffc390;
  undefined4 in_stack_ffffffffffffc394;
  _Bit_pointer in_stack_ffffffffffffc398;
  ulong *in_stack_ffffffffffffc3a0;
  undefined8 in_stack_ffffffffffffc3a8;
  ulong *in_stack_ffffffffffffc3b0;
  uint in_stack_ffffffffffffc3b8;
  undefined4 in_stack_ffffffffffffc3bc;
  _Bit_pointer local_3c40;
  Estimates local_3c18;
  OrderedEdgeCollection local_3bf8;
  uniform_int_distribution<long> local_3b80;
  Parameters local_3b70;
  undefined1 local_3ac8 [16];
  ulong local_3ab8;
  double dStack_3ab0;
  vector<bool,_std::allocator<bool>_> local_3aa8;
  vector<bool,_std::allocator<bool>_> local_3a80;
  unsigned_long local_3a58;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  uVar25 = (undefined4)cg->nVertices;
  uVar26 = (undefined4)((ulong)cg->nVertices >> 0x20);
  uVar27 = (undefined4)cg->nEdges;
  uVar28 = (undefined4)((ulong)cg->nEdges >> 0x20);
  pvVar24 = (void *)params->walk_length;
  v1 = (void *)*(params->seed_vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  local_2740._M_x[0] = (unsigned_long)uVar3;
  lVar8 = 1;
  uVar17 = local_2740._M_x[0];
  do {
    uVar17 = (ulong)(((uint)(uVar17 >> 0x1e) ^ (uint)uVar17) * 0x6c078965 + (int)lVar8);
    local_2740._M_x[lVar8] = uVar17;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_2740._M_p = 0x270;
  pOVar22 = (pointer)0x0;
  __position._M_current = (OrderedEdge *)0x0;
  pOVar23 = (OrderedEdge *)0x0;
  local_3ac8._0_8_ = local_3ac8._0_8_ & 0xffffffffffffff00;
  __n = CONCAT44(uVar26,uVar25);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffc378,__n,(bool *)local_3ac8,
             (allocator_type *)&stack0xffffffffffffc3a0);
  local_3ac8._0_8_ = local_3ac8._0_8_ & 0xffffffffffffff00;
  __n_00 = CONCAT44(uVar26,uVar27);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffc3a0,__n_00,
             (bool *)local_3ac8,(allocator_type *)&local_3c18);
  pEVar4 = cg->offsets;
  lVar8 = pEVar4[(long)v1];
  lVar11 = pEVar4[(long)v1 + 1];
  if (lVar11 == lVar8) {
    memcpy((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)local_3ac8,&local_2740,5000);
    local_3c18.fraction_of_vertices_seen = (double)(cg->nVertices + -1);
    local_3c18.estimate = 0.0;
    uVar17 = 0;
    do {
      printf("BAd luck! Trying again %d\n",uVar17);
      v1 = (void *)std::uniform_int_distribution<long>::operator()
                             ((uniform_int_distribution<long> *)&local_3c18,
                              (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                               *)local_3ac8,(param_type *)&local_3c18);
      pEVar4 = cg->offsets;
      if (0x3e6 < (uint)uVar17) break;
      uVar17 = (ulong)((uint)uVar17 + 1);
    } while (pEVar4[(long)v1 + 1] == pEVar4[(long)v1]);
    lVar8 = pEVar4[(long)v1];
    lVar11 = pEVar4[(long)v1 + 1];
  }
  dVar10 = (double)(lVar11 - lVar8);
  local_3b80._M_param._M_b = (long)dVar10 + -1;
  local_3b80._M_param._M_a = 0;
  lVar8 = pEVar4[(long)v1];
  rVar5 = std::uniform_int_distribution<long>::operator()
                    (&local_3b80,&local_2740,&local_3b80._M_param);
  uVar17 = rVar5 + lVar8;
  pvVar16 = (void *)cg->nbors[uVar17];
  lVar8 = cg->offsets[(long)pvVar16 + 1] - cg->offsets[(long)pvVar16];
  local_3ac8._0_8_ = v1;
  local_3ac8._8_8_ = pvVar16;
  local_3ab8 = uVar17;
  dStack_3ab0 = dVar10;
  if (__position._M_current == pOVar23) {
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&stack0xffffffffffffc338,
               __position,(OrderedEdge *)local_3ac8);
  }
  else {
    (__position._M_current)->index = uVar17;
    (__position._M_current)->degree = (VertexIdx)dVar10;
    (__position._M_current)->u = (VertexIdx)v1;
    (__position._M_current)->v = (VertexIdx)pvVar16;
    __position._M_current = __position._M_current + 1;
  }
  pvVar12 = (void *)((long)v1 + 0x3f);
  if (-1 < (long)v1) {
    pvVar12 = v1;
  }
  in_stack_ffffffffffffc378
  [((long)pvVar12 >> 6) + ((ulong)(((ulong)v1 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       in_stack_ffffffffffffc378
       [((long)pvVar12 >> 6) + ((ulong)(((ulong)v1 & 0x800000000000003f) < 0x8000000000000001) - 1)]
       | 1L << ((byte)v1 & 0x3f);
  pvVar12 = (void *)((long)pvVar16 + 0x3f);
  if (-1 < (long)pvVar16) {
    pvVar12 = pvVar16;
  }
  in_stack_ffffffffffffc378
  [((long)pvVar12 >> 6) + ((ulong)(((ulong)pvVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)]
       = in_stack_ffffffffffffc378
         [((long)pvVar12 >> 6) +
          ((ulong)(((ulong)pvVar16 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
         1L << ((byte)pvVar16 & 0x3f);
  lVar11 = 1;
  uVar7 = uVar17 + 0x3f;
  if (-1 < (long)uVar17) {
    uVar7 = uVar17;
  }
  iVar14 = (int)uVar17;
  in_stack_ffffffffffffc3a0
  [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
       in_stack_ffffffffffffc3a0
       [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
       1L << ((byte)uVar17 & 0x3f);
  if ((long)pvVar24 < 1) {
    dVar18 = 100.0;
    dVar21 = 0.0;
  }
  else {
    dVar21 = 0.0;
    lVar15 = 0;
    do {
      in_stack_ffffffffffffc370 = (double)(lVar8 + -1);
      local_3c18.estimate = 0.0;
      lVar9 = cg->offsets[(long)pvVar16];
      local_3c18.fraction_of_vertices_seen = in_stack_ffffffffffffc370;
      rVar5 = std::uniform_int_distribution<long>::operator()
                        ((uniform_int_distribution<long> *)&local_3c18,&local_2740,
                         (param_type *)&local_3c18);
      uVar17 = rVar5 + lVar9;
      lVar11 = lVar11 + 1;
      pvVar12 = (void *)cg->nbors[uVar17];
      lVar9 = cg->offsets[(long)pvVar12 + 1] - cg->offsets[(long)pvVar12];
      uVar25 = (undefined4)lVar8;
      uVar26 = (undefined4)((ulong)lVar8 >> 0x20);
      if (((lVar8 != 1) && (params->NB != false)) && (v1 == pvVar12)) {
        do {
          lVar8 = cg->offsets[(long)pvVar16];
          rVar5 = std::uniform_int_distribution<long>::operator()
                            ((uniform_int_distribution<long> *)&local_3c18,&local_2740,
                             (param_type *)&local_3c18);
          uVar17 = rVar5 + lVar8;
          lVar11 = lVar11 + 1;
          pvVar12 = (void *)cg->nbors[uVar17];
        } while (v1 == pvVar12);
        lVar9 = cg->offsets[(long)pvVar12 + 1] - cg->offsets[(long)pvVar12];
      }
      dStack_3ab0 = (double)CONCAT44(uVar26,uVar25);
      local_3ac8._0_8_ = pvVar16;
      local_3ac8._8_8_ = pvVar12;
      local_3ab8 = uVar17;
      if (__position._M_current == pOVar23) {
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::_M_realloc_insert<OrderedEdge>
                  ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&stack0xffffffffffffc338,
                   __position,(OrderedEdge *)local_3ac8);
        lVar8 = lVar9;
        in_stack_ffffffffffffc330 = lVar15;
        dVar18 = dVar10;
      }
      else {
        (__position._M_current)->index = uVar17;
        (__position._M_current)->degree = (VertexIdx)dStack_3ab0;
        (__position._M_current)->u = (VertexIdx)pvVar16;
        (__position._M_current)->v = (VertexIdx)pvVar12;
        __position._M_current = __position._M_current + 1;
        lVar8 = lVar9;
        in_stack_ffffffffffffc330 = lVar15;
        dVar18 = dVar10;
      }
      pvVar6 = (void *)((long)pvVar12 + 0x3f);
      if (-1 < (long)pvVar12) {
        pvVar6 = pvVar12;
      }
      in_stack_ffffffffffffc378
      [((long)pvVar6 >> 6) +
       ((ulong)(((ulong)pvVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           in_stack_ffffffffffffc378
           [((long)pvVar6 >> 6) +
            ((ulong)(((ulong)pvVar12 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
           1L << ((byte)pvVar12 & 0x3f);
      uVar7 = uVar17 + 0x3f;
      if (-1 < (long)uVar17) {
        uVar7 = uVar17;
      }
      iVar14 = (int)uVar17;
      in_stack_ffffffffffffc3a0
      [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
           in_stack_ffffffffffffc3a0
           [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           | 1L << ((byte)uVar17 & 0x3f);
      uVar17 = Escape::CGraph::getEdgeBinary(cg,(VertexIdx)v1,(VertexIdx)pvVar12);
      dVar10 = (double)CONCAT44(uVar26,uVar25);
      if (((v1 == pvVar12) || (v1 == pvVar16)) ||
         ((pvVar16 == pvVar12 || (uVar17 == 0xffffffffffffffff)))) {
        if (uVar17 != 0xffffffffffffffff) goto LAB_001068b2;
      }
      else {
        if (params->CSS == true) {
          lVar15 = lVar8;
          dVar1 = dVar10;
          if (params->NB != false) {
            dVar18 = (double)((long)dVar18 + -1);
            lVar15 = lVar8 + -1;
            dVar1 = in_stack_ffffffffffffc370;
          }
          auVar20._0_8_ = (double)(long)dVar1;
          auVar20._8_8_ = (double)lVar15;
          auVar20 = divpd(_DAT_00116050,auVar20);
          dVar18 = 1.0 / (auVar20._8_8_ + 1.0 / (double)(long)dVar18 + auVar20._0_8_);
        }
        else if (params->NB == false) {
          dVar18 = (double)(long)dVar10;
        }
        else {
          dVar18 = (double)(long)in_stack_ffffffffffffc370;
        }
        dVar21 = dVar21 + dVar18;
LAB_001068b2:
        uVar7 = uVar17 + 0x3f;
        if (-1 < (long)uVar17) {
          uVar7 = uVar17;
        }
        iVar14 = (int)uVar17;
        in_stack_ffffffffffffc3a0
        [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             in_stack_ffffffffffffc3a0
             [((long)uVar7 >> 6) + ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)
             ] | 1L << ((byte)uVar17 & 0x3f);
      }
      lVar11 = lVar11 + 1;
      lVar15 = in_stack_ffffffffffffc330 + 1;
      v1 = pvVar16;
      pvVar16 = pvVar12;
    } while ((void *)lVar15 != pvVar24);
    dVar18 = (double)lVar11 * 100.0;
    in_stack_ffffffffffffc320 = lVar8;
  }
  if (params->normalization_count_available == false) {
    local_3ac8._0_8_ = pvVar24;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)(local_3ac8 + 8),
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&stack0xffffffffffffc338);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_3aa8,(vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffc3a0);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_3a80,(vector<bool,_std::allocator<bool>_> *)&stack0xffffffffffffc378);
    local_3a58 = 0;
    local_3bf8.no_of_edges = local_3ac8._0_8_;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              (&local_3bf8.edge_list,
               (vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)(local_3ac8 + 8));
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3bf8.visited_edge_set,&local_3aa8);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_3bf8.visited_vertex_set,&local_3a80);
    local_3bf8.no_of_query = local_3a58;
    Parameters::Parameters(&local_3b70,params);
    params_00.filename._M_string_length = in_stack_ffffffffffffc320;
    params_00.filename._M_dataplus._M_p = (pointer)dVar21;
    params_00.filename.field_2._M_allocated_capacity = (size_type)params;
    params_00.filename.field_2._8_8_ = in_stack_ffffffffffffc330;
    params_00.seed_count = (VertexIdx)pOVar22;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_start = &(__position._M_current)->u;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = &pOVar23->u;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pvVar24;
    params_00.walk_length._0_4_ = SUB84(dVar18,0);
    params_00.walk_length._4_4_ = (int)((ulong)dVar18 >> 0x20);
    params_00.subsample_size._0_4_ = uVar27;
    params_00.subsample_size._4_4_ = uVar28;
    params_00._80_8_ = dVar10;
    params_00.sparsification_prob = in_stack_ffffffffffffc370;
    params_00.algo_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc378;
    params_00.algo_name._M_string_length = in_stack_ffffffffffffc380;
    params_00.algo_name.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc388;
    params_00.algo_name.field_2._8_4_ = in_stack_ffffffffffffc390;
    params_00.algo_name.field_2._12_4_ = in_stack_ffffffffffffc394;
    params_00.out_directory._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc398;
    params_00.out_directory._M_string_length = (size_type)in_stack_ffffffffffffc3a0;
    params_00.out_directory.field_2._M_allocated_capacity = in_stack_ffffffffffffc3a8;
    params_00.out_directory.field_2._8_8_ = in_stack_ffffffffffffc3b0;
    params_00.print_to_console = (bool)(char)in_stack_ffffffffffffc3b8;
    params_00.print_to_file = (bool)(char)(in_stack_ffffffffffffc3b8 >> 8);
    params_00.normalization_count_available = (bool)(char)(in_stack_ffffffffffffc3b8 >> 0x10);
    params_00.CSS = (bool)(char)(in_stack_ffffffffffffc3b8 >> 0x18);
    params_00.NB = (bool)(char)in_stack_ffffffffffffc3bc;
    params_00._165_3_ = SUB43(in_stack_ffffffffffffc3bc,1);
    EstimateEdgeCount(&local_3c18,cg,&local_3bf8,params_00,iVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.out_directory._M_dataplus._M_p != &local_3b70.out_directory.field_2) {
      operator_delete(local_3b70.out_directory._M_dataplus._M_p,
                      local_3b70.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.algo_name._M_dataplus._M_p != &local_3b70.algo_name.field_2) {
      operator_delete(local_3b70.algo_name._M_dataplus._M_p,
                      local_3b70.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3b70.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b70.filename._M_dataplus._M_p != &local_3b70.filename.field_2) {
      operator_delete(local_3b70.filename._M_dataplus._M_p,
                      local_3b70.filename.field_2._M_allocated_capacity + 1);
    }
    if (local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     );
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3bf8.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl
                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
      ;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3bf8.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3bf8.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3bf8.edge_list.
                      super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3bf8.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3bf8.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    dVar10 = local_3c18.estimate;
    if (local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3a80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_3aa8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if ((void *)local_3ac8._8_8_ != (void *)0x0) {
      operator_delete((void *)local_3ac8._8_8_,(long)dStack_3ab0 - local_3ac8._8_8_);
    }
  }
  else {
    dVar10 = (double)cg->nEdges;
  }
  dVar10 = dVar10 * 0.5 * (1.0 / (double)(long)pvVar24) * dVar21;
  if (params->CSS == false) {
    dVar10 = dVar10 * 0.3333333333333333;
  }
  __return_storage_ptr__->estimate = dVar10;
  dVar21 = 0.0;
  dVar10 = 0.0;
  if (in_stack_ffffffffffffc3b8 != 0 || in_stack_ffffffffffffc3a0 != in_stack_ffffffffffffc3b0) {
    lVar8 = 0;
    uVar17 = 0;
    puVar13 = in_stack_ffffffffffffc3a0;
    do {
      lVar8 = lVar8 + (ulong)((*puVar13 >> (uVar17 & 0x3f) & 1) != 0);
      iVar14 = (int)uVar17;
      puVar13 = puVar13 + (iVar14 == 0x3f);
      uVar17 = (ulong)(iVar14 + 1);
      if (iVar14 == 0x3f) {
        uVar17 = 0;
      }
    } while ((uint)uVar17 != in_stack_ffffffffffffc3b8 || puVar13 != in_stack_ffffffffffffc3b0);
    dVar10 = (double)lVar8 * 100.0;
  }
  if (in_stack_ffffffffffffc390 != 0 || in_stack_ffffffffffffc378 != in_stack_ffffffffffffc388) {
    lVar8 = 0;
    uVar17 = 0;
    puVar13 = in_stack_ffffffffffffc378;
    do {
      lVar8 = lVar8 + (ulong)((*puVar13 >> (uVar17 & 0x3f) & 1) != 0);
      iVar14 = (int)uVar17;
      puVar13 = puVar13 + (iVar14 == 0x3f);
      uVar17 = (ulong)(iVar14 + 1);
      if (iVar14 == 0x3f) {
        uVar17 = 0;
      }
    } while ((uint)uVar17 != in_stack_ffffffffffffc390 || puVar13 != in_stack_ffffffffffffc388);
    dVar21 = (double)lVar8 * 100.0;
  }
  auVar19._8_8_ = dVar10;
  auVar19._0_8_ = dVar21;
  dVar10 = (double)(long)__n_00;
  auVar2._8_4_ = SUB84(dVar10,0);
  auVar2._0_8_ = (double)(long)__n;
  auVar2._12_4_ = (int)((ulong)dVar10 >> 0x20);
  auVar20 = divpd(auVar19,auVar2);
  __return_storage_ptr__->fraction_of_vertices_seen = (double)auVar20._0_8_;
  __return_storage_ptr__->fraction_of_edges_seen = (double)auVar20._8_8_;
  __return_storage_ptr__->query_complexity = dVar18 / dVar10;
  if (in_stack_ffffffffffffc3a0 != (ulong *)0x0) {
    operator_delete(in_stack_ffffffffffffc3a0,(long)local_3c40 - (long)in_stack_ffffffffffffc3a0);
  }
  if (in_stack_ffffffffffffc378 != (ulong *)0x0) {
    operator_delete(in_stack_ffffffffffffc378,
                    (long)in_stack_ffffffffffffc398 - (long)in_stack_ffffffffffffc378);
  }
  if (pOVar22 != (pointer)0x0) {
    operator_delete(pOVar22,(long)pOVar23 - (long)pOVar22);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

Estimates SRW1(CGraph *cg, Parameters params)
{
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges; // Note that m is double of the number of edges in the graph
    // VertexIdx seed_count = params.seed_count;  // Unused for now. Reserved for future use
    EdgeIdx walk_length = params.walk_length;
    VertexIdx seed = params.seed_vertices[0]; // We are working with only one seed vertex for this project

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Data structures for book-keeping and local variables.
     * We do not really need the OrderedEdge vector for SRW.
     * However, if m is not available, and needs to be estimated based on the random walk,
     * then we need the collection of edges.
     */
    std::vector<OrderedEdge> edge_list;
    std::vector <bool > visited_vertex_set(n,false);
    std::vector <bool > visited_edge_set(m,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm
    double X = 0; // This variable keeps a running count of the estimator
    VertexIdx v1, v2, v3, deg_of_v1, deg_of_v2, deg_of_v3;
    EdgeIdx random_nbor_edge;

    /**
     * Algorithm Initialization: Take two steps of the random walk and collect v1 and v2.
     */

    v1 = seed;
    deg_of_v1 = cg->degree(v1); // degree of parent vertex
    if (deg_of_v1 == 0)  // If we are stuck with an isolate vertex, we change the seed
        v1 = AlternateSeed(cg,mt);
    deg_of_v1 = cg->degree(v1);
    std::uniform_int_distribution<VertexIdx> dist_parent(0, deg_of_v1 - 1);
    no_of_query++; // One query to the uniform random neighbor oracle
    random_nbor_edge = cg->offsets[v1] + dist_parent(mt); // TODO: check randomness. same seeding ok?
    v2 = cg->nbors[random_nbor_edge]; // child is the potential next vertex on the random walk
    deg_of_v2 = cg->degree(v2);// degree of the child vertex

    /**
    * Update data structures
    */
    edge_list.push_back(OrderedEdge{v1, v2, random_nbor_edge, deg_of_v1}); // Note that we do not care of the ordering of the edge.
    visited_vertex_set[v1] = true;
    visited_vertex_set[v2] = true;
    visited_edge_set[random_nbor_edge] = true;


    for (EdgeIdx wL = 0; wL < walk_length; wL++) {  // Perform a random walk of length walk_length from the vertex v2
        std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_v2 - 1); // v2 is the current last visited vertex on the random walk
        random_nbor_edge = cg->offsets[v2] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
        no_of_query++; // One query to the uniform random neighbor oracle
        v3 = cg->nbors[random_nbor_edge]; // v3 is the  new vertex on the random walk
        deg_of_v3 = cg->degree(v3);// degree of the vertex v3

        /**
         * The parameter NB decides if the random walk is non-backtracking.
         * If it is true, then v1-v2-v1 becomes an invalid state.
         * We sample another random neighbor in that case.
         * Also, in final estimation, d'(u)=d(u)-1 is used.
         */
        if (params.NB and deg_of_v2!= 1) { // if v_2 is singleton, then only one option
            while (v1 == v3) { // We reached an invalid state, resample.
                random_nbor_edge = cg->offsets[v2] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
                no_of_query++; // One query to the uniform random neighbor oracle
                v3 = cg->nbors[random_nbor_edge]; // v3 is the  new vertex on the random walk
                deg_of_v3 = cg->degree(v3);// degree of the vertex v3
            }
        }

        /**
         * Update data structures
         */
        edge_list.push_back(OrderedEdge{v2, v3, random_nbor_edge, deg_of_v2}); // Note that we do not care of the ordering of the edge.
        visited_vertex_set[v3] = true;
        visited_edge_set[random_nbor_edge] = true;

        /**
         * Check if v1, v2 and v3 forms a triangle
         * Note that (v1,v2) and (v2,v3) edges are present.
         * So we check if (v1,v3) edge is present and if all v1,v2 and v3 are distinct
         */
        EdgeIdx e = cg->getEdgeBinary(v1,v3);
        no_of_query++; // One query to the edge query oracle
        if (e!= -1 && v1!=v2 && v2!=v3 && v1!=v3) {
            if (params.CSS && params.NB) {  // Both CSS and NB are true
                double denom = (1.0 / (deg_of_v1-1)) +
                                (1.0 /(deg_of_v2-1)) +
                                (1.0 /(deg_of_v3-1));
                X += 1.0 / denom;
            }
            else if (params.CSS){ // Only CSS is true
                double denom = (1.0 / deg_of_v1) + (1.0 /deg_of_v2) + (1.0 /deg_of_v3);
                X += 1.0 / denom;
            }
            else if (params.NB) // Only NB is true
                X+= deg_of_v2 - 1;
            else                // Both CSS and NB are false
                X += deg_of_v2;


        }

        /**
         * Update data structures
         */
        if (e!= -1)
            visited_edge_set[e] =true;
        /**
         * slide the window of history!
         */
        v1 = v2;
        deg_of_v1 = deg_of_v2;
        v2 = v3;
        deg_of_v2 = deg_of_v3;
    }

    double edge_estimate = 0.0;
    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        int skip = 25;
        OrderedEdgeCollection randomEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set};
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    /**
     * Estimate the number of triangles.
     */
    double triangleEstimate = 0.0;
    if (params.CSS)
        triangleEstimate = (1.0/walk_length) * X * (edge_estimate / 2.0) ; // Note that m is actually twice the number of edges
    else
        triangleEstimate = (1.0/walk_length) * X * (edge_estimate/2.0) * (1/ 3.0) ; // Note that m is actually twice the number of edges

    /**
     * Populate the return structure
     */
    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(visited_edge_set.begin(),visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(visited_vertex_set.begin(),visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / n;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / m;
    return_estimate.query_complexity = no_of_query * 100.0 /m;

    return return_estimate;
}